

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# dynet.h
# Opt level: O0

VariableIndex __thiscall
dynet::ComputationGraph::add_function<dynet::SquaredEuclideanDistance>
          (ComputationGraph *this,initializer_list<unsigned_int> *arguments)

{
  size_type sVar1;
  reference ppNVar2;
  size_type sVar3;
  const_iterator puVar4;
  initializer_list<unsigned_int> *in_RSI;
  vector<dynet::Node_*,_std::allocator<dynet::Node_*>_> *in_RDI;
  VariableIndex new_node_index;
  VariableIndex *in_stack_00000058;
  ComputationGraph *in_stack_00000060;
  initializer_list<unsigned_int> *in_stack_ffffffffffffffa8;
  Device *pDVar5;
  SquaredEuclideanDistance *in_stack_ffffffffffffffb0;
  
  sVar1 = std::vector<dynet::Node_*,_std::allocator<dynet::Node_*>_>::size(in_RDI);
  operator_new(0x60);
  SquaredEuclideanDistance::SquaredEuclideanDistance
            (in_stack_ffffffffffffffb0,in_stack_ffffffffffffffa8);
  std::vector<dynet::Node_*,_std::allocator<dynet::Node_*>_>::push_back
            ((vector<dynet::Node_*,_std::allocator<dynet::Node_*>_> *)in_stack_ffffffffffffffb0,
             (value_type *)in_stack_ffffffffffffffa8);
  ppNVar2 = std::vector<dynet::Node_*,_std::allocator<dynet::Node_*>_>::back
                      ((vector<dynet::Node_*,_std::allocator<dynet::Node_*>_> *)
                       in_stack_ffffffffffffffb0);
  if ((*ppNVar2)->device == (Device *)0x0) {
    sVar3 = std::initializer_list<unsigned_int>::size(in_RSI);
    if (sVar3 == 0) {
      pDVar5 = dynet::default_device;
      ppNVar2 = std::vector<dynet::Node_*,_std::allocator<dynet::Node_*>_>::back
                          ((vector<dynet::Node_*,_std::allocator<dynet::Node_*>_> *)
                           in_stack_ffffffffffffffb0);
      (*ppNVar2)->device = pDVar5;
    }
    else {
      puVar4 = std::initializer_list<unsigned_int>::begin(in_RSI);
      ppNVar2 = std::vector<dynet::Node_*,_std::allocator<dynet::Node_*>_>::operator[]
                          (in_RDI,(ulong)*puVar4);
      pDVar5 = (*ppNVar2)->device;
      ppNVar2 = std::vector<dynet::Node_*,_std::allocator<dynet::Node_*>_>::back
                          ((vector<dynet::Node_*,_std::allocator<dynet::Node_*>_> *)pDVar5);
      (*ppNVar2)->device = pDVar5;
    }
  }
  set_dim_for_new_node(in_stack_00000060,in_stack_00000058);
  return (VariableIndex)sVar1;
}

Assistant:

inline VariableIndex ComputationGraph::add_function(const std::initializer_list<VariableIndex>& arguments) {
  VariableIndex new_node_index(nodes.size());
  nodes.push_back(new Function(arguments));
  if (nodes.back()->device == nullptr) {
    if (arguments.size()) {
      nodes.back()->device = nodes[*arguments.begin()]->device;
    } else {
      nodes.back()->device = dynet::default_device;
    }
  }
  set_dim_for_new_node(new_node_index);
  return new_node_index;
}